

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverFactory.cpp
# Opt level: O1

Bool __thiscall
Diligent::anon_unknown_0::ArchiverFactoryImpl::MergeArchives
          (ArchiverFactoryImpl *this,IDataBlob **ppSrcArchives,Uint32 NumSrcArchives,
          IDataBlob **ppDstArchive)

{
  IDataBlob *pIVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  string msg;
  DeviceObjectArchive Archive;
  CreateInfo local_220;
  undefined1 local_210 [224];
  RefCntAutoPtr<Diligent::IDataBlob> local_130;
  undefined1 local_120 [224];
  RefCntAutoPtr<Diligent::IDataBlob> local_40;
  
  if (NumSrcArchives != 0) {
    if (ppSrcArchives == (IDataBlob **)0x0) {
      FormatString<char[31]>((string *)local_210,(char (*) [31])"ppSrcArchives must not be null");
      DebugAssertionFailed
                ((Char *)local_210._0_8_,"MergeArchives",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
                 ,0x12f);
      if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
        operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      }
    }
    if (ppDstArchive == (IDataBlob **)0x0) {
      FormatString<char[30]>((string *)local_210,(char (*) [30])"ppDstArchive must not be null");
      DebugAssertionFailed
                ((Char *)local_210._0_8_,"MergeArchives",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
                 ,0x130);
      if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
        operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      }
    }
    if (ppSrcArchives != (IDataBlob **)0x0 && ppDstArchive != (IDataBlob **)0x0) {
      local_120._0_8_ = *ppSrcArchives;
      local_120._8_4_ = 0xffffffff;
      local_120[0xc] = false;
      DeviceObjectArchive::DeviceObjectArchive
                ((DeviceObjectArchive *)local_210,(CreateInfo *)local_120);
      if (NumSrcArchives != 1) {
        uVar2 = 2;
        if (2 < NumSrcArchives) {
          uVar2 = (ulong)NumSrcArchives;
        }
        uVar3 = 1;
        do {
          local_220.pData = ppSrcArchives[uVar3];
          local_220.ContentVersion = 0xffffffff;
          local_220.MakeCopy = false;
          DeviceObjectArchive::DeviceObjectArchive((DeviceObjectArchive *)local_120,&local_220);
          DeviceObjectArchive::Merge
                    ((DeviceObjectArchive *)local_210,(DeviceObjectArchive *)local_120);
          if (local_40.m_pObject != (IDataBlob *)0x0) {
            (*((local_40.m_pObject)->super_IObject)._vptr_IObject[2])();
            local_40.m_pObject = (IDataBlob *)0x0;
          }
          lVar4 = 200;
          do {
            std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::
            ~vector((vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *)
                    (local_120 + lVar4));
            lVar4 = lVar4 + -0x18;
          } while (lVar4 != 0x20);
          std::
          _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)local_120);
          uVar3 = uVar3 + 1;
        } while (uVar3 != uVar2);
      }
      DeviceObjectArchive::Serialize((DeviceObjectArchive *)local_210,ppDstArchive);
      pIVar1 = *ppDstArchive;
      if (local_130.m_pObject != (IDataBlob *)0x0) {
        (*((local_130.m_pObject)->super_IObject)._vptr_IObject[2])();
        local_130.m_pObject = (IDataBlob *)0x0;
      }
      lVar4 = 200;
      do {
        std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::~vector
                  ((vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *)
                   (local_210 + lVar4));
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != 0x20);
      std::
      _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_210);
      return pIVar1 != (IDataBlob *)0x0;
    }
  }
  return false;
}

Assistant:

Bool ArchiverFactoryImpl::MergeArchives(
    const IDataBlob* ppSrcArchives[],
    Uint32           NumSrcArchives,
    IDataBlob**      ppDstArchive) const
{
    if (NumSrcArchives == 0)
        return false;

    DEV_CHECK_ERR(ppSrcArchives != nullptr, "ppSrcArchives must not be null");
    DEV_CHECK_ERR(ppDstArchive != nullptr, "ppDstArchive must not be null");

    if (ppSrcArchives == nullptr || ppDstArchive == nullptr)
        return false;

    try
    {
        DeviceObjectArchive MergedArchive{DeviceObjectArchive::CreateInfo{ppSrcArchives[0]}};
        for (Uint32 i = 1; i < NumSrcArchives; ++i)
        {
            const DeviceObjectArchive Archive{DeviceObjectArchive::CreateInfo{ppSrcArchives[i]}};
            MergedArchive.Merge(Archive);
        }

        MergedArchive.Serialize(ppDstArchive);
        return *ppDstArchive != nullptr;
    }
    catch (...)
    {
        return false;
    }
}